

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O1

bool Assimp::PLY::PropertyInstance::ParseInstanceBinary
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               char **pCur,uint *bufferSize,Property *prop,PropertyInstance *p_pcOut,bool p_bBE)

{
  pointer *ppVVar1;
  iterator __position;
  IOStreamBuffer<char> *streamBuffer_00;
  ValueUnion VVar2;
  long lVar3;
  ValueUnion v;
  ValueUnion local_50;
  ulong local_48;
  Property *local_40;
  IOStreamBuffer<char> *local_38;
  
  if (prop == (Property *)0x0) {
    __assert_fail("__null != prop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                  ,0x373,
                  "static bool Assimp::PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Property *, PLY::PropertyInstance *, bool)"
                 );
  }
  if (p_pcOut == (PropertyInstance *)0x0) {
    __assert_fail("__null != p_pcOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                  ,0x374,
                  "static bool Assimp::PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Property *, PLY::PropertyInstance *, bool)"
                 );
  }
  if (prop->bIsList == true) {
    ParseValueBinary(streamBuffer,buffer,pCur,bufferSize,prop->eFirstType,&local_50,p_bBE);
    switch(prop->eFirstType) {
    case EDT_Char:
    case EDT_UChar:
    case EDT_Short:
    case EDT_UShort:
    case EDT_Int:
    case EDT_UInt:
      VVar2 = local_50;
      break;
    case EDT_Float:
      VVar2 = (ValueUnion)(long)local_50.fFloat;
      break;
    case EDT_Double:
      VVar2 = (ValueUnion)(long)local_50.fDouble;
      break;
    default:
      VVar2.fDouble = 0.0;
    }
    local_48 = (ulong)VVar2 & 0xffffffff;
    local_40 = prop;
    local_38 = streamBuffer;
    std::
    vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
    ::resize(&p_pcOut->avList,local_48);
    streamBuffer_00 = local_38;
    if (VVar2.iUInt != 0) {
      local_48 = local_48 << 3;
      lVar3 = 0;
      do {
        ParseValueBinary(streamBuffer_00,buffer,pCur,bufferSize,local_40->eType,
                         (ValueUnion *)
                         ((long)(p_pcOut->avList).
                                super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar3),p_bBE);
        lVar3 = lVar3 + 8;
      } while (local_48 != lVar3);
    }
  }
  else {
    ParseValueBinary(streamBuffer,buffer,pCur,bufferSize,prop->eType,&local_50,p_bBE);
    __position._M_current =
         (p_pcOut->avList).
         super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (p_pcOut->avList).
        super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::PLY::PropertyInstance::ValueUnion,std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>>
      ::_M_realloc_insert<Assimp::PLY::PropertyInstance::ValueUnion_const&>
                ((vector<Assimp::PLY::PropertyInstance::ValueUnion,std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>>
                  *)p_pcOut,__position,&local_50);
    }
    else {
      *__position._M_current = local_50;
      ppVVar1 = &(p_pcOut->avList).
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppVVar1 = *ppVVar1 + 1;
    }
  }
  return true;
}

Assistant:

bool PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer,
  const char* &pCur,
  unsigned int &bufferSize,
  const PLY::Property* prop,
  PLY::PropertyInstance* p_pcOut,
  bool p_bBE)
{
  ai_assert(NULL != prop);
  ai_assert(NULL != p_pcOut);

  // parse all elements
  if (prop->bIsList)
  {
    // parse the number of elements in the list
    PLY::PropertyInstance::ValueUnion v;
    PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eFirstType, &v, p_bBE);

    // convert to unsigned int
    unsigned int iNum = PLY::PropertyInstance::ConvertTo<unsigned int>(v, prop->eFirstType);

    // parse all list elements
    p_pcOut->avList.resize(iNum);
    for (unsigned int i = 0; i < iNum; ++i)
    {
      PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eType, &p_pcOut->avList[i], p_bBE);
    }
  }
  else
  {
    // parse the property
    PLY::PropertyInstance::ValueUnion v;
    PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eType, &v, p_bBE);
    p_pcOut->avList.push_back(v);
  }
  return true;
}